

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

void __thiscall
wasm::OptimizeInstructions::visitStructRMW(OptimizeInstructions *this,StructRMW *curr)

{
  Expression **input;
  Id IVar1;
  uint uVar2;
  Index IVar3;
  MemoryOrder MVar4;
  Module *module;
  PassRunner *pPVar5;
  element_type *peVar6;
  __uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> _Var7;
  pointer puVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Type TVar12;
  bool bVar13;
  Shareability SVar14;
  Index index;
  BinaryOp index_00;
  Index index_01;
  element_type *curr_00;
  Expression **ppEVar15;
  int64_t iVar16;
  Expression *pEVar17;
  StructGet *pSVar18;
  Block *rep;
  Drop *this_00;
  Expression *pEVar19;
  Binary *this_01;
  StructSet *this_02;
  ulong extraout_RDX;
  Op op;
  Type in_R8;
  Builder BVar20;
  optional<wasm::Type> type;
  anon_union_16_6_1532cd5a_for_Literal_0 local_98;
  Index local_80;
  BinaryOp local_7c;
  undefined1 local_78 [8];
  Literal val;
  Builder local_48;
  Builder builder;
  
  input = &curr->ref;
  skipNonNullCast(this,input,(Expression *)curr);
  bVar13 = trapOnNull(this,(Expression *)curr,input);
  if (bVar13) {
    return;
  }
  bVar13 = wasm::Type::isStruct(&(*input)->type);
  if (!bVar13) {
    return;
  }
  local_78 = (undefined1  [8])wasm::Type::getHeapType(&(*input)->type);
  SVar14 = HeapType::getShared((HeapType *)local_78);
  if ((SVar14 == Shared) && (curr->order == SeqCst)) {
    return;
  }
  module = (this->
           super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
           ).
           super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
           .
           super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
           .currModule;
  pPVar5 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
           ).super_Pass.runner;
  peVar6 = (element_type *)curr->value;
  val.type.id = (uintptr_t)this;
  local_48.wasm = module;
  builder.wasm = (Module *)curr;
  do {
    curr_00 = peVar6;
    local_78 = (undefined1  [8])curr_00;
    ppEVar15 = Properties::getImmediateFallthroughPtr
                         ((Expression **)local_78,&pPVar5->options,module,AllowTeeBrIf);
    BVar20 = builder;
    peVar6 = (element_type *)*ppEVar15;
  } while ((element_type *)*ppEVar15 != curr_00);
  IVar1 = *(Id *)&(curr_00->type).id;
  peVar6 = curr_00;
  while (IVar1 == RefAsId) {
    if (1 < (peVar6->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i32 -
            1U) goto LAB_009d27fd;
    peVar6 = (element_type *)
             (peVar6->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.gcData
             .super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    IVar1 = *(Id *)&(peVar6->type).id;
  }
  if (((IVar1 - 0x29 < 0x2b) && ((0x40000000005U >> ((ulong)(IVar1 - 0x29) & 0x3f) & 1) != 0)) ||
     (IVar1 == ConstId)) {
    Properties::getLiteral((Literal *)local_78,(Expression *)curr_00);
    uVar2 = *(uint *)&((BVar20.wasm)->exports).
                      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (uVar2 < 5) {
      if (uVar2 == 2) {
        Literal::makeNegOne((Literal *)&local_98.func,
                            (Type)val.field_0.gcData.
                                  super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi);
        bVar13 = Literal::operator==((Literal *)local_78,(Literal *)&local_98.func);
        Literal::~Literal((Literal *)&local_98.func);
        if (bVar13) goto LAB_009d29bb;
      }
      else {
        iVar16 = Literal::getInteger((Literal *)local_78);
        BVar20 = builder;
        if (iVar16 == 0) {
LAB_009d29bb:
          IVar3 = *(Index *)((long)&((BVar20.wasm)->exports).
                                    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
          pEVar17 = (Expression *)
                    ((BVar20.wasm)->functions).
                    super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pEVar19 = (Expression *)
                    ((BVar20.wasm)->functions).
                    super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          this_00 = (Drop *)MixedArena::allocSpace(&module->allocator,0x18,8);
          (this_00->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id =
               DropId;
          (this_00->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0
          ;
          this_00->value = pEVar19;
          Drop::finalize(this_00);
          pEVar17 = getResultOfFirst(pEVar17,(Expression *)this_00,
                                     *(Function **)(val.type.id + 0x120),
                                     *(Module **)(val.type.id + 0x128),
                                     (PassOptions *)(*(long *)(val.type.id + 8) + 0x30));
          MVar4 = *(MemoryOrder *)
                   &((builder.wasm)->functions).
                    super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          puVar8 = ((builder.wasm)->exports).
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pSVar18 = (StructGet *)MixedArena::allocSpace(&module->allocator,0x28,8);
          (pSVar18->super_SpecificExpression<(wasm::Expression::Id)66>).super_Expression._id =
               StructGetId;
          pSVar18->index = IVar3;
          pSVar18->ref = pEVar17;
          (pSVar18->super_SpecificExpression<(wasm::Expression::Id)66>).super_Expression.type.id =
               (uintptr_t)puVar8;
          pSVar18->signed_ = false;
          pSVar18->order = MVar4;
          StructGet::finalize(pSVar18);
          replaceCurrent((OptimizeInstructions *)val.type.id,(Expression *)pSVar18);
          Literal::~Literal((Literal *)local_78);
          return;
        }
      }
    }
    Literal::~Literal((Literal *)local_78);
  }
LAB_009d27fd:
  local_78 = (undefined1  [8])wasm::Type::getHeapType(&(*input)->type);
  SVar14 = HeapType::getShared((HeapType *)local_78);
  TVar12 = val.type;
  if (SVar14 == Shared) {
    return;
  }
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (_Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>)
                 ((BVar20.wasm)->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t;
  index = Builder::addVar(*(Builder **)(val.type.id + 0x120),(Function *)0x0,(Name)(auVar9 << 0x40),
                          in_R8);
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       ((BVar20.wasm)->exports).
       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  index_00 = Builder::addVar(*(Builder **)(TVar12.id + 0x120),(Function *)0x0,
                             (Name)(auVar10 << 0x40),in_R8);
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       ((BVar20.wasm)->exports).
       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  index_01 = Builder::addVar(*(Builder **)(TVar12.id + 0x120),(Function *)0x0,
                             (Name)(auVar11 << 0x40),in_R8);
  local_78 = (undefined1  [8])
             Builder::makeLocalSet
                       (&local_48,index,
                        (Expression *)
                        ((BVar20.wasm)->functions).
                        super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
  val.field_0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       Builder::makeLocalSet
                 (&local_48,index_00,
                  (Expression *)
                  ((BVar20.wasm)->functions).
                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
  IVar3 = *(Index *)((long)&((BVar20.wasm)->exports).
                            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  _Var7._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
       ((BVar20.wasm)->functions).
       super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
       super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t;
  pEVar17 = (Expression *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
  pEVar17->_id = LocalGetId;
  *(Index *)(pEVar17 + 1) = index;
  (pEVar17->type).id =
       (uintptr_t)
       _Var7._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
       super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
  puVar8 = ((builder.wasm)->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_80 = index;
  pSVar18 = (StructGet *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x28,8);
  (pSVar18->super_SpecificExpression<(wasm::Expression::Id)66>).super_Expression._id = StructGetId;
  pSVar18->index = IVar3;
  pSVar18->ref = pEVar17;
  (pSVar18->super_SpecificExpression<(wasm::Expression::Id)66>).super_Expression.type.id =
       (uintptr_t)puVar8;
  pSVar18->signed_ = false;
  pSVar18->order = Unordered;
  StructGet::finalize(pSVar18);
  BVar20 = builder;
  val.field_0.func.super_IString.str._M_str =
       (char *)Builder::makeLocalSet(&local_48,index_01,(Expression *)pSVar18);
  local_98.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_78;
  local_98.func.super_IString.str._M_str = (char *)0x3;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)extraout_RDX;
  rep = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                  (&local_48,(initializer_list<wasm::Expression_*> *)&local_98.func,type);
  switch(*(undefined4 *)
          &((BVar20.wasm)->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage) {
  case 1:
    op = Sub;
    break;
  case 2:
    op = And;
    break;
  case 3:
    op = Or;
    break;
  case 4:
    op = Xor;
    break;
  case 5:
    puVar8 = ((BVar20.wasm)->exports).
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    this_01 = (Binary *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
    (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = LocalGetId;
    this_01->op = index_00;
    (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id =
         (uintptr_t)puVar8;
    goto LAB_009d2b7b;
  default:
    op = Add;
  }
  local_7c = Abstract::getBinary((Type)((BVar20.wasm)->exports).
                                       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish,op);
  puVar8 = ((BVar20.wasm)->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pEVar17 = (Expression *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
  pEVar17->_id = LocalGetId;
  *(Index *)(pEVar17 + 1) = index_01;
  (pEVar17->type).id = (uintptr_t)puVar8;
  puVar8 = ((builder.wasm)->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pEVar19 = (Expression *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
  BVar20 = builder;
  pEVar19->_id = LocalGetId;
  *(BinaryOp *)(pEVar19 + 1) = index_00;
  (pEVar19->type).id = (uintptr_t)puVar8;
  this_01 = (Binary *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x28,8);
  (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  this_01->op = local_7c;
  this_01->left = pEVar17;
  this_01->right = pEVar19;
  Binary::finalize(this_01);
LAB_009d2b7b:
  IVar3 = *(Index *)((long)&((BVar20.wasm)->exports).
                            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  _Var7._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
       ((BVar20.wasm)->functions).
       super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
       super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t;
  pEVar17 = (Expression *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
  pEVar17->_id = LocalGetId;
  *(Index *)(pEVar17 + 1) = local_80;
  (pEVar17->type).id =
       (uintptr_t)
       _Var7._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
       super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
  this_02 = (StructSet *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x30,8);
  (this_02->super_SpecificExpression<(wasm::Expression::Id)67>).super_Expression._id = StructSetId;
  (this_02->super_SpecificExpression<(wasm::Expression::Id)67>).super_Expression.type.id = 0;
  this_02->index = IVar3;
  this_02->ref = pEVar17;
  this_02->value = (Expression *)this_01;
  this_02->order = Unordered;
  StructSet::finalize(this_02);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (&(rep->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
             ,(Expression *)this_02);
  BVar20 = builder;
  puVar8 = ((builder.wasm)->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pEVar17 = (Expression *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
  pEVar17->_id = LocalGetId;
  *(Index *)(pEVar17 + 1) = index_01;
  (pEVar17->type).id = (uintptr_t)puVar8;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (&(rep->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
             ,pEVar17);
  (rep->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id =
       (uintptr_t)
       ((BVar20.wasm)->exports).
       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  replaceCurrent((OptimizeInstructions *)val.type.id,(Expression *)rep);
  return;
}

Assistant:

void visitStructRMW(StructRMW* curr) {
    skipNonNullCast(curr->ref, curr);
    if (trapOnNull(curr, curr->ref)) {
      return;
    }

    if (!curr->ref->type.isStruct()) {
      return;
    }

    // We generally can't optimize seqcst RMWs on shared memory because they can
    // act as both the source and sink of synchronization edges, even if they
    // don't modify the in-memory value.
    if (curr->ref->type.getHeapType().isShared() &&
        curr->order == MemoryOrder::SeqCst) {
      return;
    }

    Builder builder(*getModule());

    // This RMW is either to non-shared memory or has acquire-release ordering.
    // In the former case, it trivially does not synchronize with other threads
    // and we can optimize to our heart's content. In the latter case, if we
    // know the RMW does not change the value in memory, then we can consider
    // all subsequent reads as reading from the previous write rather than from
    // this RMW op, which means this RMW does not synchronize with later reads
    // and we can optimize out the write part. This optimization wouldn't be
    // valid for sequentially consistent RMW ops because the next reads from
    // this location in the total order of seqcst ops would have to be
    // considered to be reading from this RMW and therefore would synchronize
    // with it.
    auto* value = getFallthrough(curr->value);
    if (Properties::isSingleConstantExpression(value)) {
      auto val = Properties::getLiteral(value);
      bool canOptimize = false;
      switch (curr->op) {
        case RMWAdd:
        case RMWSub:
        case RMWOr:
        case RMWXor:
          canOptimize = val.getInteger() == 0;
          break;
        case RMWAnd:
          canOptimize = val == Literal::makeNegOne(val.type);
          break;
        case RMWXchg:
          canOptimize = false;
          break;
      }
      if (canOptimize) {
        replaceCurrent(builder.makeStructGet(
          curr->index,
          getResultOfFirst(curr->ref, builder.makeDrop(curr->value)),
          curr->order,
          curr->type));
        return;
      }
    }

    // No further optimizations possible on RMWs to shared memory.
    if (curr->ref->type.getHeapType().isShared()) {
      return;
    }

    // Lower the RMW to its more basic operations. Breaking the atomic
    // operation into several non-atomic operations is safe because no other
    // thread can observe an intermediate state in the unshared memory. This
    // initially increases code size, but the more basic operations may be
    // more optimizable than the original RMW.
    // TODO: Experiment to determine whether this is worthwhile on real code.
    // Maybe we should do this optimization only when optimizing for speed over
    // size.
    auto ref = builder.addVar(getFunction(), curr->ref->type);
    auto val = builder.addVar(getFunction(), curr->type);
    auto result = builder.addVar(getFunction(), curr->type);
    auto* block = builder.makeBlock(
      {builder.makeLocalSet(ref, curr->ref),
       builder.makeLocalSet(val, curr->value),
       builder.makeLocalSet(
         result,
         builder.makeStructGet(curr->index,
                               builder.makeLocalGet(ref, curr->ref->type),
                               MemoryOrder::Unordered,
                               curr->type))});
    Expression* newVal = nullptr;
    if (curr->op == RMWXchg) {
      newVal = builder.makeLocalGet(val, curr->type);
    } else {
      Abstract::Op binop = Abstract::Add;
      switch (curr->op) {
        case RMWAdd:
          binop = Abstract::Add;
          break;
        case RMWSub:
          binop = Abstract::Sub;
          break;
        case RMWAnd:
          binop = Abstract::And;
          break;
        case RMWOr:
          binop = Abstract::Or;
          break;
        case RMWXor:
          binop = Abstract::Xor;
          break;
        case RMWXchg:
          WASM_UNREACHABLE("unexpected op");
      }
      newVal = builder.makeBinary(Abstract::getBinary(curr->type, binop),
                                  builder.makeLocalGet(result, curr->type),
                                  builder.makeLocalGet(val, curr->type));
    }
    block->list.push_back(
      builder.makeStructSet(curr->index,
                            builder.makeLocalGet(ref, curr->ref->type),
                            newVal,
                            MemoryOrder::Unordered));

    block->list.push_back(builder.makeLocalGet(result, curr->type));
    block->type = curr->type;
    replaceCurrent(block);
  }